

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_linpart.cpp
# Opt level: O0

GO Omega_h::find_total_globals(CommPtr *comm,Read<long> *globals)

{
  long lVar1;
  Read<long> local_48;
  shared_ptr<Omega_h::Comm> local_38;
  long a;
  Read<long> *globals_local;
  CommPtr *comm_local;
  
  a = (long)globals;
  globals_local = (Read<long> *)comm;
  std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_38,comm);
  Read<long>::Read(&local_48,(Read<int> *)globals);
  lVar1 = get_max<long>(&local_38,&local_48);
  Read<long>::~Read(&local_48);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_38);
  if (lVar1 < 0) {
    comm_local = (CommPtr *)0x0;
  }
  else {
    comm_local = (CommPtr *)(lVar1 + 1);
  }
  return (GO)comm_local;
}

Assistant:

GO find_total_globals(CommPtr comm, Read<GO> globals) {
  auto const a = get_max(comm, globals);
  if (a < 0) return 0;
  return a + 1;
}